

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

Type * slang::ast::EnumType::findDefinition
                 (Compilation *comp,EnumTypeSyntax *syntax,ASTContext *context)

{
  SourceRange range;
  optional<int> value;
  optional<int> value_00;
  string_view name_00;
  bool bVar1;
  reference ppVVar2;
  Symbol *pSVar3;
  Type *pTVar4;
  SyntaxNode *pSVar5;
  Type *in_RDX;
  SyntaxNode *in_RSI;
  Compilation *in_RDI;
  SourceRange SVar6;
  string_view sVar7;
  Type *type;
  Symbol *symbol;
  SourceRange dimRange;
  EvaluatedDimension dim;
  element_type dimList;
  DeclaratorSyntax *member;
  string_view name;
  VariableDimensionSyntax *in_stack_fffffffffffffee8;
  Type *in_stack_fffffffffffffef0;
  ASTContext *in_stack_ffffffffffffff00;
  SourceLocation in_stack_ffffffffffffff08;
  SourceLocation in_stack_ffffffffffffff10;
  _Storage<int,_true> in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Type *in_stack_ffffffffffffff28;
  ASTContext *in_stack_ffffffffffffff30;
  char *local_c8;
  SyntaxNode *in_stack_ffffffffffffff40;
  int32_t index;
  SourceLocation in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  SourceLocation in_stack_ffffffffffffff58;
  SourceLocation local_90;
  SourceLocation local_88;
  EvaluatedDimension local_80;
  element_type local_60;
  string_view local_58;
  const_iterator local_48;
  DeclaratorSyntax *local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  Type *local_20;
  SyntaxNode *local_18;
  Compilation *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30);
  bVar1 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::empty
                    ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x9ee36d);
  if (!bVar1) {
    local_48 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                         ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x9ee386);
    local_38 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
               ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                            *)0x9ee3a3);
    bVar1 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                      ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                       0x9ee3c0);
    if (bVar1) {
      local_58 = parsing::Token::valueText((Token *)in_stack_ffffffffffffff00);
      local_30._M_len = local_58._M_len;
      local_30._M_str = local_58._M_str;
    }
    else {
      ppVVar2 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::
                operator[](&(local_38->dimensions).
                            super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                           ,0);
      local_60 = *ppVVar2;
      ASTContext::evalUnpackedDimension
                ((ASTContext *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      bVar1 = EvaluatedDimension::isRange(&local_80);
      if (bVar1) {
        SVar6 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff40);
        std::optional<int>::optional<int_&,_true>
                  ((optional<int> *)in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8);
        local_90 = SVar6.startLoc;
        local_88 = SVar6.endLoc;
        value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
        _4_4_ = in_stack_ffffffffffffff20;
        value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
        _M_payload._M_value = in_stack_ffffffffffffff1c._M_value;
        SVar6.endLoc = in_stack_ffffffffffffff10;
        SVar6.startLoc = in_stack_ffffffffffffff08;
        in_stack_ffffffffffffff58 = local_90;
        bVar1 = ASTContext::requirePositive(in_stack_ffffffffffffff00,value,SVar6);
        if (bVar1) {
          std::optional<int>::optional<int_&,_true>
                    ((optional<int> *)local_20,(int *)in_stack_fffffffffffffee8);
          value_00.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._4_4_ = in_stack_ffffffffffffff20;
          value_00.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value = in_stack_ffffffffffffff1c._M_value
          ;
          range.endLoc = in_stack_ffffffffffffff10;
          range.startLoc = in_stack_ffffffffffffff08;
          bVar1 = ASTContext::requirePositive(in_stack_ffffffffffffff00,value_00,range);
          index = local_90._4_4_;
          in_stack_fffffffffffffef0 = local_20;
          in_stack_ffffffffffffff48 = local_88;
          if (bVar1) {
            sVar7 = parsing::Token::valueText((Token *)in_stack_ffffffffffffff00);
            in_stack_ffffffffffffff20 = (undefined4)sVar7._M_len;
            in_stack_ffffffffffffff24 = sVar7._M_len._4_4_;
            in_stack_ffffffffffffff28 = (Type *)sVar7._M_str;
            ConstantRange::lower((ConstantRange *)0x9ee57d);
            sVar7._M_str = (char *)in_stack_ffffffffffffff58;
            sVar7._M_len = in_stack_ffffffffffffff50;
            sVar7 = getEnumValueName((Compilation *)local_88,sVar7,index);
            local_30._M_len = sVar7._M_len;
            local_c8 = sVar7._M_str;
            local_30._M_str = local_c8;
            in_stack_fffffffffffffef0 = local_20;
            in_stack_ffffffffffffff48 = local_88;
            in_stack_ffffffffffffff30 = (ASTContext *)local_30._M_len;
          }
        }
      }
    }
  }
  not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0x9ee5c9);
  name_00._M_str = (char *)in_stack_ffffffffffffff58;
  name_00._M_len = in_stack_ffffffffffffff50;
  pSVar3 = Scope::find((Scope *)in_stack_ffffffffffffff48,name_00);
  if ((pSVar3 != (Symbol *)0x0) && (pSVar3->kind == EnumValue)) {
    Symbol::as<slang::ast::EnumValueSymbol>((Symbol *)0x9ee616);
    ValueSymbol::getType((ValueSymbol *)0x9ee61e);
    pTVar4 = Type::getCanonicalType(in_stack_fffffffffffffef0);
    pSVar5 = Symbol::getSyntax(&pTVar4->super_Symbol);
    if (pSVar5 == local_18) {
      pTVar4 = anon_unknown.dwarf_14f726c::createPackedDims
                         (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                          (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      return pTVar4;
    }
  }
  pTVar4 = Compilation::getErrorType(local_10);
  return pTVar4;
}

Assistant:

const Type& EnumType::findDefinition(Compilation& comp, const EnumTypeSyntax& syntax,
                                     const ASTContext& context) {
    // The enum type and all of its values should have already been created and
    // added to the parent scope. We just need to find it so we can hook up our caller.
    // To do that we're going to try to look up our first member, which should have
    // the right type. If we don't find it we know an error must have occurred during
    // type creation.
    std::string_view name;
    if (!syntax.members.empty()) {
        auto member = *syntax.members.begin();
        if (member->dimensions.empty())
            name = member->name.valueText();
        else {
            auto dimList = member->dimensions[0];
            auto dim = context.evalUnpackedDimension(*dimList);
            if (dim.isRange()) {
                SourceRange dimRange = dimList->sourceRange();
                if (context.requirePositive(std::optional(dim.range.left), dimRange) &&
                    context.requirePositive(std::optional(dim.range.right), dimRange)) {
                    name = getEnumValueName(comp, member->name.valueText(), dim.range.lower());
                }
            }
        }
    }

    auto symbol = context.scope->find(name);
    if (symbol && symbol->kind == SymbolKind::EnumValue) {
        auto& type = symbol->as<EnumValueSymbol>().getType().getCanonicalType();
        if (type.getSyntax() == &syntax)
            return createPackedDims(context, &type, syntax.dimensions);
    }

    return comp.getErrorType();
}